

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_args.c
# Opt level: O2

int mpt_config_args(mpt_config *cfg,mpt_iterator *args,mpt_logger *info)

{
  mpt_type_t type;
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  mpt_value *pmVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  mpt_property pr;
  mpt_path p;
  void *ptr;
  
  p.len = 0;
  p.first = '\0';
  p.flags = '\0';
  p.sep = '.';
  p.assign = '\0';
  p._28_4_ = 0;
  p.base._0_4_ = 0;
  p.base._4_4_ = 0;
  p.off._0_4_ = 0;
  p.off._4_4_ = 0;
  if (args == (mpt_iterator *)0x0) {
    uVar3 = (*cfg->_vptr->assign)(cfg,&p,(mpt_value *)0x0);
    uVar6 = 0;
    if (((int)uVar3 < 0) && (uVar6 = uVar3, info != (mpt_logger *)0x0)) {
      mpt_log(info,"mpt_config_args",3,"%s","unable to set default config");
    }
  }
  else {
    uVar6 = 0;
    do {
      pr._buf[0] = '\0';
      pr._buf[1] = '\0';
      pr._buf[2] = '\0';
      pr._buf[3] = '\0';
      pr._buf[4] = '\0';
      pr._buf[5] = '\0';
      pr._buf[6] = '\0';
      pr._buf[7] = '\0';
      pr._buf[8] = '\0';
      pr._buf[9] = '\0';
      pr._buf[10] = '\0';
      pr._buf[0xb] = '\0';
      pr._buf[0xc] = '\0';
      pr._buf[0xd] = '\0';
      pr._buf[0xe] = '\0';
      pr._buf[0xf] = '\0';
      pr.val._addr = (void *)0x0;
      pr.val._type = 0;
      pr.name = (char *)0x0;
      pr.desc = (char *)0x0;
      pmVar4 = (*args->_vptr->value)(args);
      if ((pmVar4 == (mpt_value *)0x0) || (ptr = pmVar4->_addr, (long *)ptr == (long *)0x0)) {
        if (info != (mpt_logger *)0x0) {
          pcVar7 = "unable to set default config";
          goto LAB_0010b3f2;
        }
      }
      else {
        type = pmVar4->_type;
        if (((type == 0x80) || (type == 0x801)) || (type - 0x100 < 0x700)) {
          puVar1 = *ptr;
          if (puVar1 == (undefined8 *)0x0) {
            if (info != (mpt_logger *)0x0) {
              pcVar7 = "missing convertable pointer";
              goto LAB_0010b3f2;
            }
          }
          else {
            iVar2 = (**(code **)*puVar1)(puVar1,0x1a,&pr);
            if ((iVar2 < 0) || (pr.val._type == 0)) {
              iVar2 = (**(code **)*puVar1)(puVar1,0x73,&pr);
              if (iVar2 < 0) {
                if (info != (mpt_logger *)0x0) {
                  pcVar7 = "invalid assinment";
LAB_0010b3f2:
                  mpt_log(info,"mpt_config_args",3,"%s",pcVar7);
                }
              }
              else {
                if (pr.name != (char *)0x0) goto LAB_0010b496;
                if (info != (mpt_logger *)0x0) {
                  pcVar7 = "invalid property name";
                  goto LAB_0010b3f2;
                }
              }
            }
            else {
              p.assign = '\0';
              mpt_path_set(&p,pr.name,-1);
LAB_0010b496:
              pcVar7 = pr.name;
              if (pr.val._type == 0) {
                pcVar5 = strchr(pr.name,0x3d);
                if (pcVar5 == (char *)0x0) {
                  if (info != (mpt_logger *)0x0) {
                    mpt_log(info,"mpt_config_args",4,"%s: %s","missing path separator",pcVar7);
                  }
                  goto LAB_0010b3f9;
                }
                p.assign = '=';
                mpt_path_set(&p,pcVar7,(int)pcVar5 - (int)pcVar7);
                pr.val._type = 0x73;
                pr._buf._0_8_ = pcVar5 + 1;
                pr.val._addr = pr._buf;
              }
              if (pr.name == (char *)0x0) {
                if (info != (mpt_logger *)0x0) {
                  uVar6 = uVar6 + 1;
                  mpt_log(info,"mpt_config_args",4,"%s: %d","missing config path",(ulong)uVar6);
                }
                iVar2 = -3;
LAB_0010b6a4:
                if (uVar6 == 0) {
                  return iVar2;
                }
                return uVar6;
              }
              iVar2 = (*cfg->_vptr->assign)(cfg,&p,&pr.val);
              if (iVar2 < 0) {
                if (info == (mpt_logger *)0x0) {
                  iVar2 = -2;
                  goto LAB_0010b6a4;
                }
                pcVar7 = (char *)pmVar4->_type;
                uVar6 = uVar6 + 1;
                iVar2 = 3;
                pcVar5 = "%s (%d): %d";
                pcVar8 = "config assign error";
              }
              else {
                if (info == (mpt_logger *)0x0) {
                  uVar6 = uVar6 + 1;
                  goto LAB_0010b3f9;
                }
                iVar2 = 0x14;
                pcVar5 = "%s: %s";
                pcVar8 = "element assiged";
                pcVar7 = pr.name;
              }
              mpt_log(info,"mpt_config_args",iVar2,pcVar5,pcVar8,pcVar7);
            }
          }
        }
        else {
          pr.name = mpt_data_tostring(&ptr,type,(size_t *)0x0);
          if (pr.name != (char *)0x0) goto LAB_0010b496;
          if (info != (mpt_logger *)0x0) {
            uVar6 = uVar6 + 1;
            mpt_log(info,"mpt_config_args",4,"%s: %d (%d)","bad string value",(ulong)uVar6,
                    pmVar4->_type);
          }
        }
      }
LAB_0010b3f9:
      iVar2 = (*args->_vptr->advance)(args);
    } while (0 < iVar2);
    if (iVar2 == 0) {
      uVar6 = 0;
    }
  }
  return uVar6;
}

Assistant:

extern int mpt_config_args(MPT_INTERFACE(config) *cfg, MPT_INTERFACE(iterator) *args, MPT_INTERFACE(logger) *info)
{
	MPT_STRUCT(path) p = MPT_PATH_INIT;
	
	int res, count, err;
	
	if (!args) {
		res = cfg->_vptr->assign(cfg, &p, 0);
		if (res < 0) {
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Error), "%s",
				        MPT_tr("unable to set default config"));
			}
			return res;
		}
		return 0;
	}
	err = 0;
	count = 0;
	do {
		MPT_STRUCT(property) pr = MPT_PROPERTY_INIT;
		const MPT_STRUCT(value) *val = args->_vptr->value(args);
		const void *ptr;
		const char *end;
		
		if (!val || !(ptr = val->_addr)) {
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Error), "%s",
				        MPT_tr("unable to set default config"));
			}
			continue;
		}
		if (MPT_type_isConvertable(val->_type)) {
			MPT_INTERFACE(convertable) *conv;
			
			if (!(conv = *((void * const *) ptr))) {
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Error), "%s",
					        MPT_tr("missing convertable pointer"));
				}
				continue;
			}
			/* get assign target */
			else if ((res = conv->_vptr->convert(conv, MPT_ENUM(TypeProperty), &pr)) >= 0 && pr.val._type) {
				p.assign = 0;
				mpt_path_set(&p, pr.name, -1);
			}
			else if ((res = conv->_vptr->convert(conv, 's', &pr.name)) < 0) {
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Error), "%s",
					        MPT_tr("invalid assinment"));
				}
				continue;
			}
			else if (!pr.name) {
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Error), "%s",
					        MPT_tr("invalid property name"));
				}
				continue;
			}
		}
		else if (!(pr.name = mpt_data_tostring(&ptr, val->_type, 0))) {
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Warning), "%s: %d (%d)",
				        MPT_tr("bad string value"), ++count, val->_type);
			}
			continue;
		}
		/* no property type assigned */
		if (!pr.val._type) {
			if (!(end = strchr(pr.name, '='))) {
				++err;
				if (info) {
					mpt_log(info, __func__, MPT_LOG(Warning), "%s: %s",
					        MPT_tr("missing path separator"), pr.name);
				}
				continue;
			}
			p.assign = '=';
			mpt_path_set(&p, pr.name, end - pr.name);
			MPT_property_set_string(&pr, end + 1);
		}
		/* no top level assign */
		if (!pr.name) {
			++err;
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Warning), "%s: %d",
				        MPT_tr("missing config path"), ++count);
			}
			return count ? count : MPT_ERROR(BadType);
		}
		/* assign config */
		if (cfg->_vptr->assign(cfg, &p, &pr.val) < 0) {
			++err;
			if (info) {
				mpt_log(info, __func__, MPT_LOG(Error), "%s (%d): %d",
				        MPT_tr("config assign error"), val->_type, ++count);
				continue;
			}
			return count ? count : MPT_ERROR(BadValue);
		}
		if (info) {
			mpt_log(info, __func__, MPT_LOG(Debug2), "%s: %s",
			        MPT_tr("element assiged"), pr.name);
			continue;
		}
		++count;
	} while ((res = args->_vptr->advance(args)) > 0);
	
	return res ? count : 0;
}